

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O2

void BrotliSplitBlockCommandsFromStored
               (MemoryManager *m,Command *cmds,size_t num_commands,size_t pos,size_t mask,
               BlockSplit *cmd_split,BlockSplitFromDecoder *cmd_split_decoder,
               size_t *cur_block_decoder)

{
  ulong uVar1;
  size_t sVar2;
  uint8_t *__dest;
  ulong uVar3;
  uint32_t *puVar4;
  void *pvVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  uint32_t uVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  
  uVar1 = cmd_split->types_alloc_size;
  uVar3 = cmd_split_decoder->num_blocks;
  if (uVar1 < uVar3) {
    if (uVar1 == 0) {
      uVar1 = uVar3;
    }
    do {
      uVar6 = uVar1;
      uVar1 = uVar6 * 2;
    } while (uVar6 < uVar3);
    __dest = (uint8_t *)BrotliAllocate(m,uVar6);
    if (cmd_split->types_alloc_size != 0) {
      memcpy(__dest,cmd_split->types,cmd_split->types_alloc_size);
    }
    BrotliFree(m,cmd_split->types);
    cmd_split->types = __dest;
    cmd_split->types_alloc_size = uVar6;
    uVar3 = cmd_split_decoder->num_blocks;
  }
  uVar1 = cmd_split->lengths_alloc_size;
  if (uVar1 < uVar3) {
    if (uVar1 == 0) {
      uVar1 = uVar3;
    }
    do {
      uVar6 = uVar1;
      uVar1 = uVar6 * 2;
    } while (uVar6 < uVar3);
    puVar4 = (uint32_t *)BrotliAllocate(m,uVar6 * 4);
    if (cmd_split->lengths_alloc_size != 0) {
      memcpy(puVar4,cmd_split->lengths,cmd_split->lengths_alloc_size << 2);
    }
    BrotliFree(m,cmd_split->lengths);
    cmd_split->lengths = puVar4;
    cmd_split->lengths_alloc_size = uVar6;
  }
  cmd_split->num_types = 0;
  cmd_split->num_blocks = 0;
  sVar8 = cmd_split_decoder->num_types;
  pvVar5 = malloc(sVar8 * 4);
  for (sVar7 = 0; sVar8 != sVar7; sVar7 = sVar7 + 1) {
    *(undefined4 *)((long)pvVar5 + sVar7 * 4) = 0xffffffff;
  }
  lVar10 = 0;
  for (sVar8 = 0; uVar9 = (uint32_t)lVar10, sVar8 != num_commands; sVar8 = sVar8 + 1) {
    puVar4 = cmd_split_decoder->positions_end;
    sVar7 = *cur_block_decoder;
    if ((puVar4[sVar7] <= pos) && (lVar10 != 0)) {
      uVar13 = *(uint *)((long)pvVar5 + (ulong)cmd_split_decoder->types[sVar7] * 4);
      if (uVar13 == 0xffffffff) {
        uVar13 = (uint)cmd_split->num_types;
        *(uint *)((long)pvVar5 + (ulong)cmd_split_decoder->types[sVar7] * 4) = uVar13;
      }
      sVar2 = cmd_split->num_blocks;
      if ((sVar2 == 0) || (uVar13 != cmd_split->types[sVar2 - 1])) {
        cmd_split->types[sVar2] = (uint8_t)uVar13;
        sVar7 = cmd_split->num_blocks;
        cmd_split->lengths[sVar7] = uVar9;
        uVar13 = (uint)cmd_split->num_types;
        bVar11 = cmd_split->types[sVar7] + 1;
        uVar12 = (uint)bVar11;
        if (bVar11 < (byte)uVar13) {
          uVar12 = uVar13;
        }
        cmd_split->num_types = (ulong)(uVar12 & 0xff);
        cmd_split->num_blocks = sVar7 + 1;
        sVar7 = *cur_block_decoder;
        puVar4 = cmd_split_decoder->positions_end;
      }
      else {
        cmd_split->lengths[sVar2 - 1] = cmd_split->lengths[sVar2 - 1] + uVar9;
      }
      sVar7 = sVar7 + 1;
      *cur_block_decoder = sVar7;
      lVar10 = 0;
    }
    while (puVar4[sVar7] <= pos) {
      *cur_block_decoder = sVar7 + 1;
      lVar10 = 0;
      sVar7 = sVar7 + 1;
    }
    lVar10 = (lVar10 + 1) - (ulong)(pos < cmd_split_decoder->positions_begin[sVar7]);
    pos = pos + ((cmds[sVar8].copy_len_ & 0x1ffffff) + cmds[sVar8].insert_len_);
  }
  if (lVar10 != 0) {
    uVar13 = *(uint *)((long)pvVar5 + (ulong)cmd_split_decoder->types[*cur_block_decoder] * 4);
    if (uVar13 == 0xffffffff) {
      uVar13 = (uint)cmd_split->num_types;
    }
    sVar8 = cmd_split->num_blocks;
    if ((sVar8 == 0) || (uVar13 != cmd_split->types[sVar8 - 1])) {
      cmd_split->types[sVar8] = (uint8_t)uVar13;
      sVar8 = cmd_split->num_blocks;
      cmd_split->lengths[sVar8] = uVar9;
      uVar13 = (uint)cmd_split->num_types;
      bVar11 = cmd_split->types[sVar8] + 1;
      uVar12 = (uint)bVar11;
      if (bVar11 < (byte)uVar13) {
        uVar12 = uVar13;
      }
      cmd_split->num_types = (ulong)(uVar12 & 0xff);
      cmd_split->num_blocks = sVar8 + 1;
    }
    else {
      cmd_split->lengths[sVar8 - 1] = cmd_split->lengths[sVar8 - 1] + uVar9;
    }
  }
  return;
}

Assistant:

void BrotliSplitBlockCommandsFromStored(
                        MemoryManager* m,
                        const Command* cmds,
                        const size_t num_commands,
                        const size_t pos,
                        const size_t mask,
                        BlockSplit* cmd_split,
                        const BlockSplitFromDecoder* cmd_split_decoder,
                        size_t* cur_block_decoder) {
    BROTLI_ENSURE_CAPACITY(
        m, uint8_t, cmd_split->types, cmd_split->types_alloc_size,
        cmd_split_decoder->num_blocks);
    BROTLI_ENSURE_CAPACITY(
        m, uint32_t, cmd_split->lengths, cmd_split->lengths_alloc_size,
        cmd_split_decoder->num_blocks);
    size_t cur_pos = pos;
    cmd_split->num_blocks = 0;
    cmd_split->num_types = 0;
    size_t cur_length = 0;
    /* Mapping of the types from decoder (they increase with each metablock)
       to the appropriate types */
    int* types_mapping = (int*)malloc(sizeof(int) * cmd_split_decoder->num_types);
    for (int i = 0; i < cmd_split_decoder->num_types; ++i) {
      types_mapping[i] = -1;
    }
    for (int i = 0; i < num_commands; ++i) {
      const Command cmd = cmds[i];
      /* If current command lies after the current block
         that means we've finished the current block.
         If some commands have fallen inside current block before
         then need to save it*/
      if (cur_pos >= cmd_split_decoder->positions_end[*cur_block_decoder] &&
            cur_length > 0) {
        /* If we haven't seen this decoder block type before
          then save a mapping of it to a current num_types */
        if (types_mapping[cmd_split_decoder->types[*cur_block_decoder]] == -1) {
          types_mapping[cmd_split_decoder->types[*cur_block_decoder]] =
                                                          cmd_split->num_types;
        }
        /* If the same block type as for a previous block then merge them */
        if (cmd_split->num_blocks > 0 &&
            types_mapping[cmd_split_decoder->types[*cur_block_decoder]] ==
              cmd_split->types[cmd_split->num_blocks - 1]) {
            cmd_split->lengths[cmd_split->num_blocks - 1] += cur_length;
        } else {
          /* Map the decoder block type to an appropriate type */
          cmd_split->types[cmd_split->num_blocks] =
                    types_mapping[cmd_split_decoder->types[*cur_block_decoder]];
          cmd_split->lengths[cmd_split->num_blocks] = cur_length;
          cmd_split->num_types = BROTLI_MAX(uint8_t, cmd_split->num_types,
                                  cmd_split->types[cmd_split->num_blocks] + 1);
          cmd_split->num_blocks++;
        }
        cur_length = 0;
        (*cur_block_decoder)++;
      }
      /* Go through decoder blocks until a block with cur_pos inside is found */
      while (cur_pos >= cmd_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length = 0;
        (*cur_block_decoder)++;
      }
      /* If command lies inside current block then
         increase an amount of commands inside current block*/
      if (cur_pos >= cmd_split_decoder->positions_begin[*cur_block_decoder] &&
          cur_pos < cmd_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length++;
      } else {
        // TODO: log that back refs are wrong
      }
      /* Shift cur_pos by the amount of symbols representing a command */
      cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
    }
    /* Save the last in metablock block */
    if (cur_length > 0) {
      if (types_mapping[cmd_split_decoder->types[*cur_block_decoder]] == -1) {
        types_mapping[cmd_split_decoder->types[*cur_block_decoder]] =
                                                            cmd_split->num_types;
      }
      /* If the same block type as for a previous block then merge them */
      if (cmd_split->num_blocks > 0 &&
          types_mapping[cmd_split_decoder->types[*cur_block_decoder]] ==
            cmd_split->types[cmd_split->num_blocks - 1]) {
          cmd_split->lengths[cmd_split->num_blocks - 1] += cur_length;
      } else {
        cmd_split->types[cmd_split->num_blocks] =
                      types_mapping[cmd_split_decoder->types[*cur_block_decoder]];
        cmd_split->lengths[cmd_split->num_blocks] = cur_length;
        cmd_split->num_types = BROTLI_MAX(uint8_t, cmd_split->num_types,
                                      cmd_split->types[cmd_split->num_blocks] + 1);
        cmd_split->num_blocks++;
      }
    }
}